

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

int __thiscall CVmObjClass::is_instance_of(CVmObjClass *this,vm_obj_id_t obj)

{
  vm_meta_entry_t *pvVar1;
  uint in_ESI;
  vm_meta_entry_t *entry;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  pvVar1 = get_meta_entry((CVmObjClass *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (pvVar1 == (vm_meta_entry_t *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*pvVar1->meta_->_vptr_CVmMetaclass[10])(pvVar1->meta_,(ulong)in_ESI);
  }
  return local_4;
}

Assistant:

int CVmObjClass::is_instance_of(VMG_ vm_obj_id_t obj)
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* if we have a valid entry, ask the metaclass object */
    if (entry != 0)
    {
        /* ask the metaclass if it's an instance of the given object */
        return entry->meta_->is_meta_instance_of(vmg_ obj);
    }
    else
    {
        /* not a valid metaclass - we can't make sense of this */
        return FALSE;
    }
}